

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O1

ggml_tallocr * ggml_tallocr_new(ggml_tallocr *__return_storage_ptr__,ggml_backend_buffer_t buffer)

{
  void *pvVar1;
  size_t sVar2;
  
  pvVar1 = ggml_backend_buffer_get_base(buffer);
  sVar2 = ggml_backend_buffer_get_alignment(buffer);
  __return_storage_ptr__->buffer = buffer;
  __return_storage_ptr__->base = pvVar1;
  __return_storage_ptr__->alignment = sVar2;
  __return_storage_ptr__->offset = (sVar2 - (ulong)pvVar1 % sVar2) % sVar2;
  return __return_storage_ptr__;
}

Assistant:

struct ggml_tallocr ggml_tallocr_new(ggml_backend_buffer_t buffer) {
    void * base = ggml_backend_buffer_get_base(buffer);
    size_t align = ggml_backend_buffer_get_alignment(buffer);

    assert(align && !(align & (align - 1))); // power of 2

    struct ggml_tallocr talloc = (struct ggml_tallocr) {
        /*.buffer    = */ buffer,
        /*.base      = */ base,
        /*.alignment = */ align,
        /*.offset    = */ aligned_offset(base, 0, align),
    };
    return talloc;
}